

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

DoubleParameter * __thiscall
CoreML::Specification::AdamOptimizer::mutable_learningrate(AdamOptimizer *this)

{
  DoubleParameter *this_00;
  AdamOptimizer *this_local;
  
  if (this->learningrate_ == (DoubleParameter *)0x0) {
    this_00 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(this_00);
    this->learningrate_ = this_00;
  }
  return this->learningrate_;
}

Assistant:

inline ::CoreML::Specification::DoubleParameter* AdamOptimizer::mutable_learningrate() {
  
  if (learningrate_ == NULL) {
    learningrate_ = new ::CoreML::Specification::DoubleParameter;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.AdamOptimizer.learningRate)
  return learningrate_;
}